

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildBrBReturn
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot DestRegSlot,uint32 forInLoopLevel,
          uint32 targetOffset)

{
  code *pcVar1;
  bool bVar2;
  Opnd *srcOpnd_00;
  RegOpnd *destOpnd_00;
  BranchInstr *branchInstr_00;
  undefined4 *puVar3;
  BranchInstr *branchInstr;
  RegOpnd *destOpnd;
  Opnd *srcOpnd;
  uint32 targetOffset_local;
  uint32 forInLoopLevel_local;
  RegSlot DestRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  srcOpnd_00 = BuildForInEnumeratorOpnd(this,forInLoopLevel,offset);
  destOpnd_00 = BuildDstOpnd(this,DestRegSlot,TyVar,false,false);
  branchInstr_00 =
       IR::BranchInstr::New
                 (newOpcode,&destOpnd_00->super_Opnd,(LabelInstr *)0x0,srcOpnd_00,this->m_func);
  AddBranchInstr(this,branchInstr_00,offset,targetOffset);
  if (newOpcode == BrOnEmpty) {
    IR::Opnd::SetValueType(&destOpnd_00->super_Opnd,ValueType::String);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1b25,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
IRBuilder::BuildBrBReturn(Js::OpCode newOpcode, uint32 offset, Js::RegSlot DestRegSlot, uint32 forInLoopLevel, uint32 targetOffset)
{
    IR::Opnd *srcOpnd = this->BuildForInEnumeratorOpnd(forInLoopLevel, offset);
    IR::RegOpnd *     destOpnd = this->BuildDstOpnd(DestRegSlot);
    IR::BranchInstr * branchInstr = IR::BranchInstr::New(newOpcode, destOpnd, nullptr, srcOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);

    switch (newOpcode)
    {
    case Js::OpCode::BrOnEmpty:
        destOpnd->SetValueType(ValueType::String);
        break;
    default:
        Assert(false);
        break;
    };
}